

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

int __thiscall Board::get_result(Board *this,int player_number)

{
  int iVar1;
  mapped_type *pmVar2;
  uint local_2c;
  int local_28;
  uint local_24;
  int current_score;
  uint i;
  int lowest_score;
  int player_number_local;
  Board *this_local;
  
  current_score = 0x7fffffff;
  i = player_number;
  _lowest_score = this;
  for (local_24 = 1; iVar1 = current_score, local_24 < 5; local_24 = local_24 + 1) {
    local_2c = local_24;
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->m_player_scores,(key_type *)&local_2c);
    local_28 = *pmVar2;
    if (local_28 < current_score) {
      current_score = local_28;
    }
  }
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](&this->m_player_scores,(key_type *)&i);
  this_local._4_4_ = (uint)(iVar1 == *pmVar2);
  return this_local._4_4_;
}

Assistant:

int Board::get_result(int player_number) // TODO implement draw - 2 people have same score
{
    int lowest_score = INT32_MAX;

    for (unsigned int i(1); i < 5; ++i) {
        int current_score = m_player_scores[i];
        if(current_score < lowest_score) {
            lowest_score = current_score;
        }
    }

    if(lowest_score == m_player_scores[player_number]) {
        return 1;
    }
    return 0;
}